

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void constructAutomaticIndex
               (Parse *pParse,WhereClause *pWC,SrcItem *pSrc,Bitmask notReady,WhereLevel *pLevel)

{
  byte *pbVar1;
  undefined1 *puVar2;
  byte bVar3;
  short sVar4;
  Vdbe *p;
  Table *pTVar5;
  WhereLoop *p_00;
  SrcList *pSVar6;
  bool bVar7;
  int addr;
  int iVar8;
  int iVar9;
  int iVar10;
  WhereTerm *pWVar11;
  Expr *pEVar12;
  Index *pIdx;
  CollSeq *pCVar13;
  Op *pOVar14;
  char *pcVar15;
  long lVar16;
  ulong uVar17;
  int iVar18;
  int iVar19;
  ulong uVar20;
  ulong uVar21;
  WhereTerm *pWVar22;
  ulong local_88;
  Expr *local_80;
  long local_70;
  char *zNotUsed;
  
  p = pParse->pVdbe;
  addr = sqlite3VdbeAddOp0(p,0xf);
  pTVar5 = pSrc->pTab;
  pWVar22 = pWC->a;
  pWVar11 = pWVar22 + pWC->nTerm;
  p_00 = pLevel->pWLoop;
  local_80 = (Expr *)0x0;
  bVar7 = false;
  local_88 = 0;
  iVar18 = 0;
  for (; pWVar22 < pWVar11; pWVar22 = pWVar22 + 1) {
    if ((pWVar22->wtFlags & 2) == 0) {
      pEVar12 = pWVar22->pExpr;
      iVar8 = sqlite3ExprIsTableConstraint(pEVar12,pSrc);
      if (iVar8 != 0) {
        pEVar12 = sqlite3ExprDup(pParse->db,pEVar12,0);
        local_80 = sqlite3ExprAnd(pParse,local_80,pEVar12);
      }
    }
    iVar8 = termCanDriveIndex(pWVar22,pSrc,notReady);
    if (iVar8 != 0) {
      iVar8 = (pWVar22->u).x.leftColumn;
      uVar20 = 1L << ((byte)iVar8 & 0x3f);
      if (0x3f < (long)iVar8) {
        uVar20 = 0x8000000000000000;
      }
      if (!bVar7) {
        sqlite3_log(0x11c,"automatic index on %s(%s)",pTVar5->zName,pTVar5->aCol[iVar8].zCnName);
      }
      bVar7 = true;
      if ((local_88 & uVar20) == 0) {
        iVar8 = whereLoopResize(pParse->db,p_00,iVar18 + 1);
        if (iVar8 != 0) goto LAB_001a812a;
        p_00->aLTerm[iVar18] = pWVar22;
        local_88 = local_88 | uVar20;
        bVar7 = true;
        iVar18 = iVar18 + 1;
      }
    }
  }
  p_00->nLTerm = (u16)iVar18;
  (p_00->u).btree.nEq = (u16)iVar18;
  p_00->wsFlags = 0x4241;
  uVar20 = (~local_88 | 0x8000000000000000) & pSrc->colUsed;
  sVar4 = pTVar5->nCol;
  iVar8 = 0x3f;
  if (sVar4 < 0x3f) {
    iVar8 = (int)sVar4;
  }
  uVar17 = 0;
  if ((short)iVar8 < 1) {
    iVar8 = 0;
  }
  for (; (long)iVar8 != uVar17; uVar17 = uVar17 + 1) {
    iVar18 = iVar18 + (uint)((uVar20 >> (uVar17 & 0x3f) & 1) != 0);
  }
  iVar10 = 1;
  if ((long)pSrc->colUsed < 0) {
    iVar10 = sVar4 + -0x3e;
  }
  iVar19 = 0;
  pIdx = sqlite3AllocateIndexObject(pParse->db,(i16)(iVar10 + iVar18),0,&zNotUsed);
  if (pIdx != (Index *)0x0) {
    (p_00->u).btree.pIndex = pIdx;
    pIdx->zName = "auto-index";
    pIdx->pTable = pTVar5;
    uVar17 = 0;
    for (pWVar22 = pWC->a; pWVar22 < pWVar11; pWVar22 = pWVar22 + 1) {
      iVar9 = termCanDriveIndex(pWVar22,pSrc,notReady);
      if (iVar9 != 0) {
        iVar9 = (pWVar22->u).x.leftColumn;
        uVar21 = 1L << ((byte)iVar9 & 0x3f);
        if (0x3f < iVar9) {
          uVar21 = 0x8000000000000000;
        }
        if ((uVar21 & uVar17) == 0) {
          pEVar12 = pWVar22->pExpr;
          pIdx->aiColumn[iVar19] = (i16)iVar9;
          pCVar13 = sqlite3ExprCompareCollSeq(pParse,pEVar12);
          pcVar15 = "BINARY";
          if (pCVar13 != (CollSeq *)0x0) {
            pcVar15 = pCVar13->zName;
          }
          uVar17 = uVar17 | uVar21;
          pIdx->azColl[iVar19] = pcVar15;
          iVar19 = iVar19 + 1;
        }
      }
    }
    for (uVar17 = 0; lVar16 = (long)iVar19, (long)iVar8 != uVar17; uVar17 = uVar17 + 1) {
      if ((uVar20 >> (uVar17 & 0x3f) & 1) != 0) {
        pIdx->aiColumn[lVar16] = (i16)uVar17;
        pIdx->azColl[lVar16] = "BINARY";
        iVar19 = iVar19 + 1;
      }
    }
    if ((long)pSrc->colUsed < 0) {
      for (iVar8 = 0x3f; iVar8 < pTVar5->nCol; iVar8 = iVar8 + 1) {
        pIdx->aiColumn[lVar16] = (i16)iVar8;
        pIdx->azColl[lVar16] = "BINARY";
        lVar16 = lVar16 + 1;
      }
      iVar19 = (int)lVar16;
    }
    pIdx->aiColumn[iVar19] = -1;
    pIdx->azColl[iVar19] = "BINARY";
    iVar8 = pParse->nTab;
    pParse->nTab = iVar8 + 1;
    pLevel->iIdxCur = iVar8;
    sqlite3VdbeAddOp2(p,0x74,iVar8,iVar10 + iVar18);
    sqlite3VdbeSetP4KeyInfo(pParse,pIdx);
    if ((pParse->db->dbOptFlags & 0x80000) == 0) {
      iVar18 = pParse->nMem + 1;
      pParse->nMem = iVar18;
      pLevel->regFilter = iVar18;
      sqlite3VdbeAddOp2(p,0x4d,10000,iVar18);
    }
    pSVar6 = pWC->pWInfo->pTabList;
    bVar3 = pLevel->iFrom;
    if ((pSVar6->a[bVar3].fg.field_0x1 & 0x20) == 0) {
      iVar18 = sqlite3VdbeAddOp1(p,0x24,pLevel->iTabCur);
      local_70 = 0;
    }
    else {
      iVar18 = pSVar6->a[bVar3].regReturn;
      iVar8 = sqlite3VdbeAddOp2(p,0x47,0,0);
      sqlite3VdbeAddOp3(p,0xb,iVar18,0,pSVar6->a[bVar3].addrFillSub);
      iVar18 = sqlite3VdbeAddOp1(p,0xc,iVar18);
      local_70 = (long)iVar8;
    }
    if (local_80 == (Expr *)0x0) {
      iVar8 = 0;
    }
    else {
      iVar8 = pParse->nLabel + -1;
      pParse->nLabel = iVar8;
      sqlite3ExprIfFalse(pParse,local_80,iVar8,0x10);
      pbVar1 = (byte *)((long)&p_00->wsFlags + 2);
      *pbVar1 = *pbVar1 | 2;
    }
    iVar10 = sqlite3GetTempReg(pParse);
    iVar9 = sqlite3GenerateIndexKey(pParse,pIdx,pLevel->iTabCur,iVar10,0,(int *)0x0,(Index *)0x0,0);
    if (pLevel->regFilter != 0) {
      sqlite3VdbeAddOp4Int(p,0xb4,pLevel->regFilter,0,iVar9,(uint)(p_00->u).btree.nEq);
    }
    sqlite3VdbeAddOp2(p,0x8a,pLevel->iIdxCur,iVar10);
    if (0 < (long)p->nOp) {
      p->aOp[(long)p->nOp + -1].p5 = 0x10;
    }
    if (local_80 != (Expr *)0x0) {
      sqlite3VdbeResolveLabel(p,iVar8);
    }
    if ((pSVar6->a[bVar3].fg.field_0x1 & 0x20) == 0) {
      sqlite3VdbeAddOp2(p,0x27,pLevel->iTabCur,iVar18 + 1);
      if (0 < (long)p->nOp) {
        p->aOp[(long)p->nOp + -1].p5 = 3;
      }
    }
    else {
      if (p->db->mallocFailed == '\0') {
        pOVar14 = p->aOp + local_70;
      }
      else {
        pOVar14 = (Op *)&sqlite3VdbeGetOp_dummy;
      }
      pOVar14->p2 = iVar9 + iVar19;
      translateColumnToCopy
                (pParse,iVar18,pLevel->iTabCur,pSVar6->a[bVar3].regResult,pLevel->iIdxCur);
      sqlite3VdbeGoto(p,iVar18);
      puVar2 = &pSVar6->a[bVar3].fg.field_0x1;
      *puVar2 = *puVar2 & 0xdf;
    }
    sqlite3VdbeJumpHere(p,iVar18);
    if (iVar10 != 0) {
      bVar3 = pParse->nTempReg;
      if ((ulong)bVar3 < 8) {
        pParse->nTempReg = bVar3 + 1;
        pParse->aTempReg[bVar3] = iVar10;
      }
    }
    sqlite3VdbeJumpHere(p,addr);
  }
LAB_001a812a:
  sqlite3ExprDelete(pParse->db,local_80);
  return;
}

Assistant:

static SQLITE_NOINLINE void constructAutomaticIndex(
  Parse *pParse,              /* The parsing context */
  const WhereClause *pWC,     /* The WHERE clause */
  const SrcItem *pSrc,        /* The FROM clause term to get the next index */
  const Bitmask notReady,     /* Mask of cursors that are not available */
  WhereLevel *pLevel          /* Write new index here */
){
  int nKeyCol;                /* Number of columns in the constructed index */
  WhereTerm *pTerm;           /* A single term of the WHERE clause */
  WhereTerm *pWCEnd;          /* End of pWC->a[] */
  Index *pIdx;                /* Object describing the transient index */
  Vdbe *v;                    /* Prepared statement under construction */
  int addrInit;               /* Address of the initialization bypass jump */
  Table *pTable;              /* The table being indexed */
  int addrTop;                /* Top of the index fill loop */
  int regRecord;              /* Register holding an index record */
  int n;                      /* Column counter */
  int i;                      /* Loop counter */
  int mxBitCol;               /* Maximum column in pSrc->colUsed */
  CollSeq *pColl;             /* Collating sequence to on a column */
  WhereLoop *pLoop;           /* The Loop object */
  char *zNotUsed;             /* Extra space on the end of pIdx */
  Bitmask idxCols;            /* Bitmap of columns used for indexing */
  Bitmask extraCols;          /* Bitmap of additional columns */
  u8 sentWarning = 0;         /* True if a warnning has been issued */
  Expr *pPartial = 0;         /* Partial Index Expression */
  int iContinue = 0;          /* Jump here to skip excluded rows */
  SrcItem *pTabItem;          /* FROM clause term being indexed */
  int addrCounter = 0;        /* Address where integer counter is initialized */
  int regBase;                /* Array of registers where record is assembled */

  /* Generate code to skip over the creation and initialization of the
  ** transient index on 2nd and subsequent iterations of the loop. */
  v = pParse->pVdbe;
  assert( v!=0 );
  addrInit = sqlite3VdbeAddOp0(v, OP_Once); VdbeCoverage(v);

  /* Count the number of columns that will be added to the index
  ** and used to match WHERE clause constraints */
  nKeyCol = 0;
  pTable = pSrc->pTab;
  pWCEnd = &pWC->a[pWC->nTerm];
  pLoop = pLevel->pWLoop;
  idxCols = 0;
  for(pTerm=pWC->a; pTerm<pWCEnd; pTerm++){
    Expr *pExpr = pTerm->pExpr;
    /* Make the automatic index a partial index if there are terms in the
    ** WHERE clause (or the ON clause of a LEFT join) that constrain which
    ** rows of the target table (pSrc) that can be used. */
    if( (pTerm->wtFlags & TERM_VIRTUAL)==0
     && sqlite3ExprIsTableConstraint(pExpr, pSrc)
    ){
      pPartial = sqlite3ExprAnd(pParse, pPartial,
                                sqlite3ExprDup(pParse->db, pExpr, 0));
    }
    if( termCanDriveIndex(pTerm, pSrc, notReady) ){
      int iCol;
      Bitmask cMask;
      assert( (pTerm->eOperator & (WO_OR|WO_AND))==0 );
      iCol = pTerm->u.x.leftColumn;
      cMask = iCol>=BMS ? MASKBIT(BMS-1) : MASKBIT(iCol);
      testcase( iCol==BMS );
      testcase( iCol==BMS-1 );
      if( !sentWarning ){
        sqlite3_log(SQLITE_WARNING_AUTOINDEX,
            "automatic index on %s(%s)", pTable->zName,
            pTable->aCol[iCol].zCnName);
        sentWarning = 1;
      }
      if( (idxCols & cMask)==0 ){
        if( whereLoopResize(pParse->db, pLoop, nKeyCol+1) ){
          goto end_auto_index_create;
        }
        pLoop->aLTerm[nKeyCol++] = pTerm;
        idxCols |= cMask;
      }
    }
  }
  assert( nKeyCol>0 || pParse->db->mallocFailed );
  pLoop->u.btree.nEq = pLoop->nLTerm = nKeyCol;
  pLoop->wsFlags = WHERE_COLUMN_EQ | WHERE_IDX_ONLY | WHERE_INDEXED
                     | WHERE_AUTO_INDEX;

  /* Count the number of additional columns needed to create a
  ** covering index.  A "covering index" is an index that contains all
  ** columns that are needed by the query.  With a covering index, the
  ** original table never needs to be accessed.  Automatic indices must
  ** be a covering index because the index will not be updated if the
  ** original table changes and the index and table cannot both be used
  ** if they go out of sync.
  */
  extraCols = pSrc->colUsed & (~idxCols | MASKBIT(BMS-1));
  mxBitCol = MIN(BMS-1,pTable->nCol);
  testcase( pTable->nCol==BMS-1 );
  testcase( pTable->nCol==BMS-2 );
  for(i=0; i<mxBitCol; i++){
    if( extraCols & MASKBIT(i) ) nKeyCol++;
  }
  if( pSrc->colUsed & MASKBIT(BMS-1) ){
    nKeyCol += pTable->nCol - BMS + 1;
  }

  /* Construct the Index object to describe this index */
  pIdx = sqlite3AllocateIndexObject(pParse->db, nKeyCol+1, 0, &zNotUsed);
  if( pIdx==0 ) goto end_auto_index_create;
  pLoop->u.btree.pIndex = pIdx;
  pIdx->zName = "auto-index";
  pIdx->pTable = pTable;
  n = 0;
  idxCols = 0;
  for(pTerm=pWC->a; pTerm<pWCEnd; pTerm++){
    if( termCanDriveIndex(pTerm, pSrc, notReady) ){
      int iCol;
      Bitmask cMask;
      assert( (pTerm->eOperator & (WO_OR|WO_AND))==0 );
      iCol = pTerm->u.x.leftColumn;
      cMask = iCol>=BMS ? MASKBIT(BMS-1) : MASKBIT(iCol);
      testcase( iCol==BMS-1 );
      testcase( iCol==BMS );
      if( (idxCols & cMask)==0 ){
        Expr *pX = pTerm->pExpr;
        idxCols |= cMask;
        pIdx->aiColumn[n] = pTerm->u.x.leftColumn;
        pColl = sqlite3ExprCompareCollSeq(pParse, pX);
        assert( pColl!=0 || pParse->nErr>0 ); /* TH3 collate01.800 */
        pIdx->azColl[n] = pColl ? pColl->zName : sqlite3StrBINARY;
        n++;
      }
    }
  }
  assert( (u32)n==pLoop->u.btree.nEq );

  /* Add additional columns needed to make the automatic index into
  ** a covering index */
  for(i=0; i<mxBitCol; i++){
    if( extraCols & MASKBIT(i) ){
      pIdx->aiColumn[n] = i;
      pIdx->azColl[n] = sqlite3StrBINARY;
      n++;
    }
  }
  if( pSrc->colUsed & MASKBIT(BMS-1) ){
    for(i=BMS-1; i<pTable->nCol; i++){
      pIdx->aiColumn[n] = i;
      pIdx->azColl[n] = sqlite3StrBINARY;
      n++;
    }
  }
  assert( n==nKeyCol );
  pIdx->aiColumn[n] = XN_ROWID;
  pIdx->azColl[n] = sqlite3StrBINARY;

  /* Create the automatic index */
  assert( pLevel->iIdxCur>=0 );
  pLevel->iIdxCur = pParse->nTab++;
  sqlite3VdbeAddOp2(v, OP_OpenAutoindex, pLevel->iIdxCur, nKeyCol+1);
  sqlite3VdbeSetP4KeyInfo(pParse, pIdx);
  VdbeComment((v, "for %s", pTable->zName));
  if( OptimizationEnabled(pParse->db, SQLITE_BloomFilter) ){
    pLevel->regFilter = ++pParse->nMem;
    sqlite3VdbeAddOp2(v, OP_Blob, 10000, pLevel->regFilter);
  }

  /* Fill the automatic index with content */
  pTabItem = &pWC->pWInfo->pTabList->a[pLevel->iFrom];
  if( pTabItem->fg.viaCoroutine ){
    int regYield = pTabItem->regReturn;
    addrCounter = sqlite3VdbeAddOp2(v, OP_Integer, 0, 0);
    sqlite3VdbeAddOp3(v, OP_InitCoroutine, regYield, 0, pTabItem->addrFillSub);
    addrTop =  sqlite3VdbeAddOp1(v, OP_Yield, regYield);
    VdbeCoverage(v);
    VdbeComment((v, "next row of %s", pTabItem->pTab->zName));
  }else{
    addrTop = sqlite3VdbeAddOp1(v, OP_Rewind, pLevel->iTabCur); VdbeCoverage(v);
  }
  if( pPartial ){
    iContinue = sqlite3VdbeMakeLabel(pParse);
    sqlite3ExprIfFalse(pParse, pPartial, iContinue, SQLITE_JUMPIFNULL);
    pLoop->wsFlags |= WHERE_PARTIALIDX;
  }
  regRecord = sqlite3GetTempReg(pParse);
  regBase = sqlite3GenerateIndexKey(
      pParse, pIdx, pLevel->iTabCur, regRecord, 0, 0, 0, 0
  );
  if( pLevel->regFilter ){
    sqlite3VdbeAddOp4Int(v, OP_FilterAdd, pLevel->regFilter, 0,
                         regBase, pLoop->u.btree.nEq);
  }
  sqlite3VdbeAddOp2(v, OP_IdxInsert, pLevel->iIdxCur, regRecord);
  sqlite3VdbeChangeP5(v, OPFLAG_USESEEKRESULT);
  if( pPartial ) sqlite3VdbeResolveLabel(v, iContinue);
  if( pTabItem->fg.viaCoroutine ){
    sqlite3VdbeChangeP2(v, addrCounter, regBase+n);
    testcase( pParse->db->mallocFailed );
    assert( pLevel->iIdxCur>0 );
    translateColumnToCopy(pParse, addrTop, pLevel->iTabCur,
                          pTabItem->regResult, pLevel->iIdxCur);
    sqlite3VdbeGoto(v, addrTop);
    pTabItem->fg.viaCoroutine = 0;
  }else{
    sqlite3VdbeAddOp2(v, OP_Next, pLevel->iTabCur, addrTop+1); VdbeCoverage(v);
    sqlite3VdbeChangeP5(v, SQLITE_STMTSTATUS_AUTOINDEX);
  }
  sqlite3VdbeJumpHere(v, addrTop);
  sqlite3ReleaseTempReg(pParse, regRecord);

  /* Jump here when skipping the initialization */
  sqlite3VdbeJumpHere(v, addrInit);

end_auto_index_create:
  sqlite3ExprDelete(pParse->db, pPartial);
}